

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Payload>::destruct_value
          (storage_t<tinyusdz::Payload> *this)

{
  tinyusdz::Path::~Path((Path *)(this + 0x40));
  if (*(storage_t<tinyusdz::Payload> **)(this + 0x20) != this + 0x30) {
    operator_delete(*(storage_t<tinyusdz::Payload> **)(this + 0x20),*(long *)(this + 0x30) + 1);
  }
  if (*(storage_t<tinyusdz::Payload> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::Payload> **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }